

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.cpp
# Opt level: O1

UniValue * MempoolInfoToJSON(UniValue *__return_storage_ptr__,CTxMemPool *pool)

{
  string key;
  string key_00;
  string key_01;
  string key_02;
  string key_03;
  string key_04;
  string key_05;
  string key_06;
  string key_07;
  string key_08;
  string key_09;
  UniValue val;
  UniValue val_00;
  UniValue val_01;
  UniValue val_02;
  UniValue val_03;
  UniValue val_04;
  UniValue val_05;
  UniValue val_06;
  UniValue val_07;
  UniValue val_08;
  UniValue val_09;
  bool bVar1;
  CFeeRate CVar2;
  CFeeRate amount;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock14;
  unsigned_long in_stack_fffffffffffffa48;
  pointer pbVar3;
  RecursiveMutex *pRVar4;
  bool bVar5;
  undefined1 in_stack_fffffffffffffa59 [15];
  _Alloc_hider in_stack_fffffffffffffa68;
  size_type in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa80 [56];
  pointer in_stack_fffffffffffffab8;
  pointer pUVar6;
  undefined1 local_538 [16];
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_528;
  UniValue local_4f8;
  long *local_4a0 [2];
  long local_490 [2];
  UniValue local_480;
  long *local_428 [2];
  long local_418 [2];
  UniValue local_408;
  long *local_3b0 [2];
  long local_3a0 [2];
  UniValue local_390;
  long *local_338 [2];
  long local_328 [2];
  UniValue local_318;
  long *local_2c0 [2];
  long local_2b0 [2];
  UniValue local_2a0;
  long *local_248 [2];
  long local_238 [2];
  UniValue local_228;
  long *local_1d0 [2];
  long local_1c0 [2];
  UniValue local_1b0;
  long *local_158 [2];
  long local_148 [2];
  UniValue local_138;
  long *local_e0 [2];
  long local_d0 [2];
  UniValue local_c0;
  long *local_68 [2];
  long local_58 [2];
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined8 local_37;
  undefined4 local_2f;
  undefined2 local_2b;
  char local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar4 = &pool->cs;
  bVar5 = false;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffa50);
  local_48 = &local_38;
  __return_storage_ptr__->typ = VOBJ;
  (__return_storage_ptr__->val)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->val).field_2;
  (__return_storage_ptr__->val).field_2._M_local_buf[0] = '\0';
  *(undefined8 *)((long)&(__return_storage_ptr__->val).field_2 + 1) = local_37;
  *(undefined4 *)((long)&(__return_storage_ptr__->val).field_2 + 9) = local_2f;
  *(undefined2 *)((long)&(__return_storage_ptr__->val).field_2 + 0xd) = local_2b;
  (__return_storage_ptr__->val).field_2._M_local_buf[0xf] = local_29;
  (__return_storage_ptr__->val)._M_string_length = 0;
  local_40 = 0;
  local_38 = 0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"loaded","");
  bVar1 = CTxMemPool::GetLoadTried(pool);
  local_528._M_impl._0_1_ = bVar1;
  UniValue::UniValue<bool,_bool,_true>(&local_c0,(bool *)&local_528);
  key._M_string_length = (size_type)pRVar4;
  key._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key.field_2._M_local_buf[0] = bVar5;
  key.field_2._1_15_ = in_stack_fffffffffffffa59;
  val.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val._0_8_ = in_stack_fffffffffffffa68._M_p;
  val.val._M_string_length = in_stack_fffffffffffffa78;
  val.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_c0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.val._M_dataplus._M_p != &local_c0.val.field_2) {
    operator_delete(local_c0.val._M_dataplus._M_p,local_c0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"size","");
  local_528._M_impl._0_8_ = CTxMemPool::size(pool);
  UniValue::UniValue<long,_long,_true>(&local_138,(long *)&local_528);
  key_00._M_string_length = (size_type)pRVar4;
  key_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_00.field_2._M_local_buf[0] = bVar5;
  key_00.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_00.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_00._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_00.val._M_string_length = in_stack_fffffffffffffa78;
  val_00.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_00,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_138.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.val._M_dataplus._M_p != &local_138.val.field_2) {
    operator_delete(local_138.val._M_dataplus._M_p,local_138.val.field_2._M_allocated_capacity + 1);
  }
  if (local_e0[0] != local_d0) {
    operator_delete(local_e0[0],local_d0[0] + 1);
  }
  local_158[0] = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"bytes","");
  local_528._M_impl._0_8_ = pool->totalTxSize;
  UniValue::UniValue<long,_long,_true>(&local_1b0,(long *)&local_528);
  key_01._M_string_length = (size_type)pRVar4;
  key_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_01.field_2._M_local_buf[0] = bVar5;
  key_01.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_01.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_01._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_01.val._M_string_length = in_stack_fffffffffffffa78;
  val_01.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_01.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_01.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_01,val_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.val._M_dataplus._M_p != &local_1b0.val.field_2) {
    operator_delete(local_1b0.val._M_dataplus._M_p,local_1b0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_158[0] != local_148) {
    operator_delete(local_158[0],local_148[0] + 1);
  }
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"usage","");
  local_528._M_impl._0_8_ = CTxMemPool::DynamicMemoryUsage(pool);
  UniValue::UniValue<long,_long,_true>(&local_228,(long *)&local_528);
  key_02._M_string_length = (size_type)pRVar4;
  key_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_02.field_2._M_local_buf[0] = bVar5;
  key_02.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_02.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_02._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_02.val._M_string_length = in_stack_fffffffffffffa78;
  val_02.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_02.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_02.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_02,val_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_228.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_228.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.val._M_dataplus._M_p != &local_228.val.field_2) {
    operator_delete(local_228.val._M_dataplus._M_p,local_228.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"total_fee","");
  ValueFromAmount(&local_2a0,pool->m_total_fee);
  key_03._M_string_length = (size_type)pRVar4;
  key_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_03.field_2._M_local_buf[0] = bVar5;
  key_03.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_03.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_03._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_03.val._M_string_length = in_stack_fffffffffffffa78;
  val_03.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_03.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_03.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_03,val_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2a0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2a0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0.val._M_dataplus._M_p != &local_2a0.val.field_2) {
    operator_delete(local_2a0.val._M_dataplus._M_p,local_2a0.val.field_2._M_allocated_capacity + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  local_2c0[0] = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"maxmempool","");
  UniValue::UniValue<const_long_&,_long,_true>(&local_318,&(pool->m_opts).max_size_bytes);
  key_04._M_string_length = (size_type)pRVar4;
  key_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_04.field_2._M_local_buf[0] = bVar5;
  key_04.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_04.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_04._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_04.val._M_string_length = in_stack_fffffffffffffa78;
  val_04.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_04.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_04.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_04,val_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_318.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318.val._M_dataplus._M_p != &local_318.val.field_2) {
    operator_delete(local_318.val._M_dataplus._M_p,local_318.val.field_2._M_allocated_capacity + 1);
  }
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0],local_2b0[0] + 1);
  }
  local_338[0] = local_328;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"mempoolminfee","");
  CVar2 = CTxMemPool::GetMinFee(pool,(pool->m_opts).max_size_bytes);
  amount.nSatoshisPerK = (pool->m_opts).min_relay_feerate.nSatoshisPerK;
  if (amount.nSatoshisPerK < CVar2.nSatoshisPerK) {
    amount = CVar2;
  }
  ValueFromAmount(&local_390,amount.nSatoshisPerK);
  key_05._M_string_length = (size_type)pRVar4;
  key_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_05.field_2._M_local_buf[0] = bVar5;
  key_05.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_05.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_05._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_05.val._M_string_length = in_stack_fffffffffffffa78;
  val_05.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_05.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_05.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_05,val_05);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_390.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_390.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390.val._M_dataplus._M_p != &local_390.val.field_2) {
    operator_delete(local_390.val._M_dataplus._M_p,local_390.val.field_2._M_allocated_capacity + 1);
  }
  if (local_338[0] != local_328) {
    operator_delete(local_338[0],local_328[0] + 1);
  }
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"minrelaytxfee","");
  ValueFromAmount(&local_408,(pool->m_opts).min_relay_feerate.nSatoshisPerK);
  key_06._M_string_length = (size_type)pRVar4;
  key_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_06.field_2._M_local_buf[0] = bVar5;
  key_06.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_06.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_06._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_06.val._M_string_length = in_stack_fffffffffffffa78;
  val_06.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_06.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_06.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_06,val_06);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_408.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_408.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_408.val._M_dataplus._M_p != &local_408.val.field_2) {
    operator_delete(local_408.val._M_dataplus._M_p,local_408.val.field_2._M_allocated_capacity + 1);
  }
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0],local_3a0[0] + 1);
  }
  local_428[0] = local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_428,"incrementalrelayfee","");
  ValueFromAmount(&local_480,(pool->m_opts).incremental_relay_feerate.nSatoshisPerK);
  key_07._M_string_length = (size_type)pRVar4;
  key_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa48;
  key_07.field_2._M_local_buf[0] = bVar5;
  key_07.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_07.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_07._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_07.val._M_string_length = in_stack_fffffffffffffa78;
  val_07.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_07.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_07.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_07,val_07);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_480.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_480.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480.val._M_dataplus._M_p != &local_480.val.field_2) {
    operator_delete(local_480.val._M_dataplus._M_p,local_480.val.field_2._M_allocated_capacity + 1);
  }
  if (local_428[0] != local_418) {
    operator_delete(local_428[0],local_418[0] + 1);
  }
  local_4a0[0] = local_490;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4a0,"unbroadcastcount","");
  CTxMemPool::GetUnbroadcastTxs
            ((set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)&local_528,pool);
  UniValue::UniValue<unsigned_long,_unsigned_long,_true>
            (&local_4f8,(unsigned_long *)&stack0xfffffffffffffa48);
  key_08._M_string_length = (size_type)pRVar4;
  key_08._M_dataplus._M_p = (pointer)local_528._M_impl.super__Rb_tree_header._M_node_count;
  key_08.field_2._M_local_buf[0] = bVar5;
  key_08.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_08.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_08._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_08.val._M_string_length = in_stack_fffffffffffffa78;
  val_08.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_08.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_08.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffab8;
  UniValue::pushKV(__return_storage_ptr__,key_08,val_08);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4f8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4f8.keys);
  pbVar3 = (pointer)local_528._M_impl.super__Rb_tree_header._M_node_count;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.val._M_dataplus._M_p != &local_4f8.val.field_2) {
    operator_delete(local_4f8.val._M_dataplus._M_p,local_4f8.val.field_2._M_allocated_capacity + 1);
    pbVar3 = (pointer)local_528._M_impl.super__Rb_tree_header._M_node_count;
  }
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_528);
  if (local_4a0[0] != local_490) {
    operator_delete(local_4a0[0],local_490[0] + 1);
  }
  pUVar6 = (pointer)local_538;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffab8,"fullrbf","");
  UniValue::UniValue<const_bool_&,_bool,_true>
            ((UniValue *)&stack0xfffffffffffffa60,&(pool->m_opts).full_rbf);
  key_09._M_string_length = (size_type)pRVar4;
  key_09._M_dataplus._M_p = (pointer)pbVar3;
  key_09.field_2._M_local_buf[0] = bVar5;
  key_09.field_2._1_15_ = in_stack_fffffffffffffa59;
  val_09.val._M_dataplus._M_p = (pointer)in_stack_fffffffffffffa70;
  val_09._0_8_ = in_stack_fffffffffffffa68._M_p;
  val_09.val._M_string_length = in_stack_fffffffffffffa78;
  val_09.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffa80._0_16_;
  val_09.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffffa80._16_24_;
  val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffa80._40_8_;
  val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffa80._48_8_;
  val_09.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pUVar6;
  UniValue::pushKV(__return_storage_ptr__,key_09,val_09);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffaa0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffa88);
  if (in_stack_fffffffffffffa68._M_p != &stack0xfffffffffffffa78) {
    operator_delete(in_stack_fffffffffffffa68._M_p,in_stack_fffffffffffffa78 + 1);
  }
  if (pUVar6 != (pointer)local_538) {
    operator_delete(pUVar6,local_538._0_8_ + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&stack0xfffffffffffffa50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue MempoolInfoToJSON(const CTxMemPool& pool)
{
    // Make sure this call is atomic in the pool.
    LOCK(pool.cs);
    UniValue ret(UniValue::VOBJ);
    ret.pushKV("loaded", pool.GetLoadTried());
    ret.pushKV("size", (int64_t)pool.size());
    ret.pushKV("bytes", (int64_t)pool.GetTotalTxSize());
    ret.pushKV("usage", (int64_t)pool.DynamicMemoryUsage());
    ret.pushKV("total_fee", ValueFromAmount(pool.GetTotalFee()));
    ret.pushKV("maxmempool", pool.m_opts.max_size_bytes);
    ret.pushKV("mempoolminfee", ValueFromAmount(std::max(pool.GetMinFee(), pool.m_opts.min_relay_feerate).GetFeePerK()));
    ret.pushKV("minrelaytxfee", ValueFromAmount(pool.m_opts.min_relay_feerate.GetFeePerK()));
    ret.pushKV("incrementalrelayfee", ValueFromAmount(pool.m_opts.incremental_relay_feerate.GetFeePerK()));
    ret.pushKV("unbroadcastcount", uint64_t{pool.GetUnbroadcastTxs().size()});
    ret.pushKV("fullrbf", pool.m_opts.full_rbf);
    return ret;
}